

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  BumpAllocator *alloc;
  UnarySelectPropertyExprSyntax *pUVar1;
  Token *unaff_retaddr;
  SelectorSyntax **in_stack_00000008;
  Token *in_stack_00000010;
  Token *in_stack_00000018;
  BumpAllocator *in_stack_00000020;
  BumpAllocator *in_stack_000000f8;
  Token *in_stack_00000100;
  BumpAllocator *in_stack_ffffffffffffffa8;
  
  parsing::Token::deepClone(in_stack_00000100,in_stack_000000f8);
  parsing::Token::deepClone(in_stack_00000100,in_stack_000000f8);
  if ((((PropertyExprSyntax *)((long)__fn + 0x30))->super_SyntaxNode).parent == (SyntaxNode *)0x0) {
    alloc = (BumpAllocator *)0x0;
  }
  else {
    alloc = (BumpAllocator *)
            deepClone<slang::syntax::SelectorSyntax>
                      ((SelectorSyntax *)__child_stack,in_stack_ffffffffffffffa8);
  }
  parsing::Token::deepClone(in_stack_00000100,in_stack_000000f8);
  not_null<slang::syntax::PropertyExprSyntax_*>::operator*
            ((not_null<slang::syntax::PropertyExprSyntax_*> *)0x7c11e3);
  deepClone<slang::syntax::PropertyExprSyntax>((PropertyExprSyntax *)__child_stack,alloc);
  pUVar1 = BumpAllocator::
           emplace<slang::syntax::UnarySelectPropertyExprSyntax,slang::parsing::Token,slang::parsing::Token,slang::syntax::SelectorSyntax*,slang::parsing::Token,slang::syntax::PropertyExprSyntax&>
                     (in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_00000008,
                      unaff_retaddr,(PropertyExprSyntax *)__fn);
  return (int)pUVar1;
}

Assistant:

static SyntaxNode* clone(const UnarySelectPropertyExprSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<UnarySelectPropertyExprSyntax>(
        node.op.deepClone(alloc),
        node.openBracket.deepClone(alloc),
        node.selector ? deepClone(*node.selector, alloc) : nullptr,
        node.closeBracket.deepClone(alloc),
        *deepClone<PropertyExprSyntax>(*node.expr, alloc)
    );
}